

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O0

void __thiscall
ft::multiset<int,_ft::less<int>,_ft::allocator<int>_>::erase
          (multiset<int,_ft::less<int>,_ft::allocator<int>_> *this,iterator *first,iterator *last)

{
  bool bVar1;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_60;
  undefined1 local_38 [8];
  iterator tmp;
  iterator *last_local;
  iterator *first_local;
  multiset<int,_ft::less<int>,_ft::allocator<int>_> *this_local;
  
  tmp.m_node = (treeNode<int> *)last;
  while( true ) {
    bVar1 = operator!=(first,last);
    if (!bVar1) break;
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::treeIterator
              ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_38,first);
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(first);
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::treeIterator
              (&local_60,(treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_38);
    erase(this,&local_60);
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator(&local_60);
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator
              ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_38);
  }
  return;
}

Assistant:

void	erase(iterator first, iterator last) {
		while (first != last) {
			iterator	tmp = first;
			++first;
			this->erase(tmp);
		}
	}